

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void upb_inttable_compact(upb_inttable *t,upb_Arena *a)

{
  bool bVar1;
  double dVar2;
  upb_Arena *a_00;
  _Bool _Var3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  upb_value val;
  uintptr_t key;
  upb_value val_1;
  upb_inttable new_t;
  uintptr_t max [17];
  size_t counts [17];
  upb_value local_1b0;
  uintptr_t local_1a8;
  uint local_19c;
  upb_value local_198;
  size_t local_190;
  upb_Arena *local_188;
  upb_inttable local_180;
  ulong local_148 [18];
  long local_b8 [17];
  
  local_188 = a;
  memset(local_b8,0,0x88);
  memset(local_148,0,0x88);
  local_180.t.count = 0xffffffffffffffff;
  _Var3 = upb_inttable_next(t,&local_1a8,&local_1b0,(intptr_t *)&local_180);
  if (_Var3) {
    do {
      if (local_1a8 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (uint)((local_1a8 & local_1a8 - 1) != 0);
      }
      lVar10 = 0x3f;
      if (local_1a8 != 0) {
        for (; local_1a8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      iVar6 = (int)lVar10;
      if (local_1a8 < 2) {
        iVar6 = 0;
      }
      uVar7 = iVar6 + uVar7;
      if (0xf < uVar7) {
        uVar7 = 0x10;
      }
      uVar9 = (ulong)(uVar7 << 3);
      uVar8 = *(ulong *)((long)local_148 + uVar9);
      if (*(ulong *)((long)local_148 + uVar9) <= local_1a8) {
        uVar8 = local_1a8;
      }
      *(ulong *)((long)local_148 + uVar9) = uVar8;
      *(long *)((long)local_b8 + uVar9) = *(long *)((long)local_b8 + uVar9) + 1;
      _Var3 = upb_inttable_next(t,&local_1a8,&local_1b0,(intptr_t *)&local_180);
    } while (_Var3);
  }
  a_00 = local_188;
  uVar4 = t->array_count + (t->t).count;
  uVar8 = 0x10;
  uVar9 = uVar4;
  do {
    if (local_b8[uVar8] != 0) {
      auVar13._8_4_ = (int)(uVar9 >> 0x20);
      auVar13._0_8_ = uVar9;
      auVar13._12_4_ = 0x45300000;
      if ((double)(1 << ((byte)uVar8 & 0x1f)) * 0.1 <=
          (auVar13._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) goto LAB_00120951;
      uVar9 = uVar9 - local_b8[uVar8];
    }
    bVar1 = 1 < uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar1);
  uVar8 = 0;
LAB_00120951:
  lVar10 = uVar4 - uVar9;
  if (uVar4 < uVar9) {
    __assert_fail("arr_count <= upb_inttable_count(t)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/hash/common.c"
                  ,0x2c6,"void upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  auVar12._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar12._0_8_ = lVar10;
  auVar12._12_4_ = 0x45300000;
  dVar2 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) / 0.85 + 1.0;
  uVar11 = (ulong)dVar2;
  uVar5 = 0;
  if (uVar4 != uVar9) {
    uVar5 = (long)(dVar2 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
  }
  local_190 = local_148[(int)uVar8] + 1;
  uVar7 = 0;
  if (uVar5 != 0) {
    uVar7 = (uint)((uVar5 & uVar5 - 1) != 0);
  }
  lVar10 = 0x3f;
  if (uVar5 != 0) {
    for (; uVar5 >> lVar10 == 0; lVar10 = lVar10 + -1) {
    }
  }
  iVar6 = (int)lVar10;
  if (uVar5 < 2) {
    iVar6 = 0;
  }
  local_19c = 0x10;
  if (iVar6 + uVar7 < 0x10) {
    local_19c = iVar6 + uVar7;
  }
  upb_inttable_sizedinit(&local_180,local_190,local_19c,local_188);
  local_1a8 = 0xffffffffffffffff;
  _Var3 = upb_inttable_next(t,&local_1b0.val,&local_198,(intptr_t *)&local_1a8);
  if (_Var3) {
    do {
      upb_inttable_insert(&local_180,local_1b0.val,local_198,a_00);
      _Var3 = upb_inttable_next(t,&local_1b0.val,&local_198,(intptr_t *)&local_1a8);
    } while (_Var3);
  }
  if (local_180.array_size == local_190) {
    if (local_19c == local_180.t.size_lg2) {
      t->array_count = local_180.array_count;
      t->array = local_180.array;
      t->array_size = local_180.array_size;
      *(ulong *)&(t->t).size_lg2 = CONCAT71(local_180.t._17_7_,local_180.t.size_lg2);
      (t->t).entries = local_180.t.entries;
      (t->t).count = local_180.t.count;
      (t->t).mask = local_180.t.mask;
      (t->t).max_count = local_180.t.max_count;
      return;
    }
    __assert_fail("new_t.t.size_lg2 == hashsize_lg2",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/hash/common.c"
                  ,0x2db,"void upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  __assert_fail("new_t.array_size == arr_size",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/hash/common.c"
                ,0x2da,"void upb_inttable_compact(upb_inttable *, upb_Arena *)");
}

Assistant:

void upb_inttable_compact(upb_inttable* t, upb_Arena* a) {
  /* A power-of-two histogram of the table keys. */
  size_t counts[UPB_MAXARRSIZE + 1] = {0};

  /* The max key in each bucket. */
  uintptr_t max[UPB_MAXARRSIZE + 1] = {0};

  {
    intptr_t iter = UPB_INTTABLE_BEGIN;
    uintptr_t key;
    upb_value val;
    while (upb_inttable_next(t, &key, &val, &iter)) {
      int bucket = log2ceil(key);
      max[bucket] = UPB_MAX(max[bucket], key);
      counts[bucket]++;
    }
  }

  /* Find the largest power of two that satisfies the MIN_DENSITY
   * definition (while actually having some keys). */
  size_t arr_count = upb_inttable_count(t);
  int size_lg2;
  upb_inttable new_t;

  for (size_lg2 = ARRAY_SIZE(counts) - 1; size_lg2 > 0; size_lg2--) {
    if (counts[size_lg2] == 0) {
      /* We can halve again without losing any entries. */
      continue;
    } else if (arr_count >= (1 << size_lg2) * MIN_DENSITY) {
      break;
    }

    arr_count -= counts[size_lg2];
  }

  UPB_ASSERT(arr_count <= upb_inttable_count(t));

  {
    /* Insert all elements into new, perfectly-sized table. */
    size_t arr_size = max[size_lg2] + 1; /* +1 so arr[max] will fit. */
    size_t hash_count = upb_inttable_count(t) - arr_count;
    size_t hash_size = hash_count ? (hash_count / MAX_LOAD) + 1 : 0;
    int hashsize_lg2 = log2ceil(hash_size);

    upb_inttable_sizedinit(&new_t, arr_size, hashsize_lg2, a);

    {
      intptr_t iter = UPB_INTTABLE_BEGIN;
      uintptr_t key;
      upb_value val;
      while (upb_inttable_next(t, &key, &val, &iter)) {
        upb_inttable_insert(&new_t, key, val, a);
      }
    }

    UPB_ASSERT(new_t.array_size == arr_size);
    UPB_ASSERT(new_t.t.size_lg2 == hashsize_lg2);
  }
  *t = new_t;
}